

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O0

void Cmd_test(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  FDoubleProd *local_28;
  FProduction *prod;
  int parsept;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  prod._0_4_ = 1;
  prod._4_4_ = key;
  _parsept = who;
  who_local = (APlayerPawn *)argv;
  local_28 = (FDoubleProd *)ParseExpression(argv,(int *)&prod);
  iVar2 = (int)prod;
  if ((local_28 == (FDoubleProd *)0x0) ||
     (iVar1 = FCommandLine::argc((FCommandLine *)who_local), iVar1 <= iVar2)) {
    Printf("Usage: test <expr> <true cmd> [false cmd]\n");
  }
  else {
    if ((local_28->super_FProduction).Type == PROD_String) {
      local_28 = StringToDouble((FProduction *)local_28);
    }
    if ((local_28->Value != 0.0) || (NAN(local_28->Value))) {
      pcVar3 = FCommandLine::operator[]((FCommandLine *)who_local,(int)prod);
      AddCommandString(pcVar3,0);
    }
    else {
      iVar2 = (int)prod + 1;
      prod._0_4_ = iVar2;
      iVar1 = FCommandLine::argc((FCommandLine *)who_local);
      if (iVar2 < iVar1) {
        pcVar3 = FCommandLine::operator[]((FCommandLine *)who_local,(int)prod);
        AddCommandString(pcVar3,0);
      }
    }
  }
  if (local_28 != (FDoubleProd *)0x0) {
    M_Free(local_28);
  }
  return;
}

Assistant:

CCMD (test)
{
	int parsept = 1;
	FProduction *prod = ParseExpression (argv, parsept);

	if (prod == NULL || parsept >= argv.argc())
	{
		Printf ("Usage: test <expr> <true cmd> [false cmd]\n");
	}
	else
	{
		if (prod->Type == PROD_String)
		{
			prod = StringToDouble (prod);
		}

		if (static_cast<FDoubleProd *>(prod)->Value != 0.0)
		{
			AddCommandString (argv[parsept]);
		}
		else if (++parsept < argv.argc())
		{
			AddCommandString (argv[parsept]);
		}
	}
	if (prod != NULL)
	{
		M_Free (prod);
	}
}